

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

bool pbrt::WriteFile(string *filename,string *contents)

{
  byte bVar1;
  string *in_RSI;
  string *in_RDI;
  ofstream out;
  string local_248 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  char *in_stack_fffffffffffffde0;
  ostream local_218 [512];
  string *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  std::ofstream::ofstream(local_218,in_RDI,_S_out);
  std::operator<<(local_218,local_18);
  std::ofstream::close();
  bVar1 = std::ios::good();
  local_1 = (bVar1 & 1) != 0;
  if (!(bool)local_1) {
    LastError();
    ErrorString_abi_cxx11_((int)((ulong)local_218 >> 0x20));
    Error<std::__cxx11::string_const&,std::__cxx11::string>
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::__cxx11::string::~string(local_248);
  }
  std::ofstream::~ofstream(local_218);
  return (bool)(local_1 & 1);
}

Assistant:

bool WriteFile(const std::string &filename, const std::string &contents) {
    std::ofstream out(filename);
    out << contents;
    out.close();
    if (!out.good()) {
        Error("%s: %s", filename, ErrorString());
        return false;
    }
    return true;
}